

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# nuklear.h
# Opt level: O0

int nk_rect_height_compare(void *a,void *b)

{
  undefined4 local_34;
  nk_rp_rect *q;
  nk_rp_rect *p;
  void *b_local;
  void *a_local;
  
  if (*(ushort *)((long)b + 6) < *(ushort *)((long)a + 6)) {
    a_local._4_4_ = 0xffffffff;
  }
  else if (*(ushort *)((long)a + 6) < *(ushort *)((long)b + 6)) {
    a_local._4_4_ = 1;
  }
  else {
    if (*(ushort *)((long)b + 4) < *(ushort *)((long)a + 4)) {
      local_34 = 0xffffffff;
    }
    else {
      local_34 = (uint)(*(ushort *)((long)a + 4) < *(ushort *)((long)b + 4));
    }
    a_local._4_4_ = local_34;
  }
  return a_local._4_4_;
}

Assistant:

NK_INTERN int
nk_rect_height_compare(const void *a, const void *b)
{
    const struct nk_rp_rect *p = (const struct nk_rp_rect *) a;
    const struct nk_rp_rect *q = (const struct nk_rp_rect *) b;
    if (p->h > q->h)
        return -1;
    if (p->h < q->h)
        return  1;
    return (p->w > q->w) ? -1 : (p->w < q->w);
}